

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msa_helper.c
# Opt level: O0

void helper_msa_addv_h_mips(CPUMIPSState *env,uint32_t wd,uint32_t ws,uint32_t wt)

{
  fpr_t *pfVar1;
  fpr_t *pfVar2;
  fpr_t *pfVar3;
  int64_t iVar4;
  wr_t *pwt;
  wr_t *pws;
  wr_t *pwd;
  uint32_t wt_local;
  uint32_t ws_local;
  uint32_t wd_local;
  CPUMIPSState *env_local;
  
  pfVar1 = (env->active_fpu).fpr + wd;
  pfVar2 = (env->active_fpu).fpr + ws;
  pfVar3 = (env->active_fpu).fpr + wt;
  iVar4 = msa_addv_df(1,(long)*(short *)pfVar2,(long)*(short *)pfVar3);
  *(short *)pfVar1 = (short)iVar4;
  iVar4 = msa_addv_df(1,(long)*(short *)((long)pfVar2 + 2),(long)*(short *)((long)pfVar3 + 2));
  *(short *)((long)pfVar1 + 2) = (short)iVar4;
  iVar4 = msa_addv_df(1,(long)*(short *)((long)pfVar2 + 4),(long)*(short *)((long)pfVar3 + 4));
  *(short *)((long)pfVar1 + 4) = (short)iVar4;
  iVar4 = msa_addv_df(1,(long)*(short *)((long)pfVar2 + 6),(long)*(short *)((long)pfVar3 + 6));
  *(short *)((long)pfVar1 + 6) = (short)iVar4;
  iVar4 = msa_addv_df(1,(long)*(short *)((long)pfVar2 + 8),(long)*(short *)((long)pfVar3 + 8));
  *(short *)((long)pfVar1 + 8) = (short)iVar4;
  iVar4 = msa_addv_df(1,(long)*(short *)((long)pfVar2 + 10),(long)*(short *)((long)pfVar3 + 10));
  *(short *)((long)pfVar1 + 10) = (short)iVar4;
  iVar4 = msa_addv_df(1,(long)*(short *)((long)pfVar2 + 0xc),(long)*(short *)((long)pfVar3 + 0xc));
  *(short *)((long)pfVar1 + 0xc) = (short)iVar4;
  iVar4 = msa_addv_df(1,(long)*(short *)((long)pfVar2 + 0xe),(long)*(short *)((long)pfVar3 + 0xe));
  *(short *)((long)pfVar1 + 0xe) = (short)iVar4;
  return;
}

Assistant:

void helper_msa_addv_h(CPUMIPSState *env,
                       uint32_t wd, uint32_t ws, uint32_t wt)
{
    wr_t *pwd = &(env->active_fpu.fpr[wd].wr);
    wr_t *pws = &(env->active_fpu.fpr[ws].wr);
    wr_t *pwt = &(env->active_fpu.fpr[wt].wr);

    pwd->h[0]  = msa_addv_df(DF_HALF, pws->h[0],  pwt->h[0]);
    pwd->h[1]  = msa_addv_df(DF_HALF, pws->h[1],  pwt->h[1]);
    pwd->h[2]  = msa_addv_df(DF_HALF, pws->h[2],  pwt->h[2]);
    pwd->h[3]  = msa_addv_df(DF_HALF, pws->h[3],  pwt->h[3]);
    pwd->h[4]  = msa_addv_df(DF_HALF, pws->h[4],  pwt->h[4]);
    pwd->h[5]  = msa_addv_df(DF_HALF, pws->h[5],  pwt->h[5]);
    pwd->h[6]  = msa_addv_df(DF_HALF, pws->h[6],  pwt->h[6]);
    pwd->h[7]  = msa_addv_df(DF_HALF, pws->h[7],  pwt->h[7]);
}